

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvocationOverWriteCase::
genShaderMainBlock_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  string *psVar1;
  ostream *poVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong *puVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  int iVar11;
  string localID;
  ostringstream s;
  ostringstream buf;
  long *local_3e8;
  long local_3e0;
  long local_3d8;
  long lStack_3d0;
  long *local_3c8;
  undefined8 local_3c0;
  long local_3b8;
  undefined8 uStack_3b0;
  ulong *local_3a8;
  long local_3a0;
  ulong local_398;
  long lStack_390;
  ulong *local_388;
  long local_380;
  ulong local_378 [2];
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  long *local_348 [2];
  long local_338 [2];
  string *local_328;
  string local_320 [3];
  ios_base local_2b0 [264];
  undefined1 local_1a8 [376];
  
  local_328 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (0 < *(int *)((long)this + 0x90)) {
    iVar8 = 0;
    do {
      if (*(int *)((long)this + 0x78) == 1) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, ",0x3b);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar8);
          lVar7 = 9;
          pcVar9 = "), 456);\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, "
                     ,0x37);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar8);
          lVar7 = 0x19;
          pcVar9 = "), ivec4(456, 0, 0, 0));\n";
        }
LAB_014c7694:
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar9,lVar7);
      }
      else if (*(int *)((long)this + 0x78) == 0) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, ",0x3d);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar8);
          lVar7 = 10;
          pcVar9 = ")], 456);\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\tsb_store.values[getIndex(gl_LocalInvocationID.xy, ",
                     0x33);
          poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,iVar8);
          lVar7 = 10;
          pcVar9 = ")] = 456;\n";
        }
        goto LAB_014c7694;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < *(int *)((long)this + 0x90));
  }
  InterInvocationTestCase::genBarrierSource_abi_cxx11_(local_320,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_320[0]._M_dataplus._M_p,local_320[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)((long)this + 0x90)) {
    iVar8 = 0;
    iVar11 = 0;
    do {
      if (*(char *)((long)this + 0x7e) == '\x01') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::ostream::operator<<(local_320,iVar11 + 4);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_348,0,(char *)0x0,0x1c5fbe3);
        local_368 = &local_358;
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_358 = *plVar5;
          lStack_350 = plVar3[3];
        }
        else {
          local_358 = *plVar5;
          local_368 = (long *)*plVar3;
        }
        local_360 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_368);
        local_3a8 = &local_398;
        puVar6 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar6) {
          local_398 = *puVar6;
          lStack_390 = plVar3[3];
        }
        else {
          local_398 = *puVar6;
          local_3a8 = (ulong *)*plVar3;
        }
        local_3a0 = plVar3[1];
        *plVar3 = (long)puVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::ostream::operator<<(local_320,iVar8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
        uVar10 = 0xf;
        if (local_3a8 != &local_398) {
          uVar10 = local_398;
        }
        if (uVar10 < (ulong)(local_380 + local_3a0)) {
          uVar10 = 0xf;
          if (local_388 != local_378) {
            uVar10 = local_378[0];
          }
          if (uVar10 < (ulong)(local_380 + local_3a0)) goto LAB_014c78dd;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_3a8);
        }
        else {
LAB_014c78dd:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_388);
        }
        local_3c8 = &local_3b8;
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_3b8 = *plVar3;
          uStack_3b0 = puVar4[3];
        }
        else {
          local_3b8 = *plVar3;
          local_3c8 = (long *)*puVar4;
        }
        local_3c0 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)plVar3 = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_3c8);
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_3d8 = *plVar5;
          lStack_3d0 = plVar3[3];
          local_3e8 = &local_3d8;
        }
        else {
          local_3d8 = *plVar5;
          local_3e8 = (long *)*plVar3;
        }
        local_3e0 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,local_3b8 + 1);
        }
        if (local_388 != local_378) {
          operator_delete(local_388,local_378[0] + 1);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8,local_398 + 1);
        }
        if (local_368 != &local_358) {
          operator_delete(local_368,local_358 + 1);
        }
        if (local_348[0] != local_338) {
          operator_delete(local_348[0],local_338[0] + 1);
        }
      }
      else {
        local_3e8 = &local_3d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3e8,"gl_LocalInvocationID.xy","");
      }
      if (*(int *)((long)this + 0x78) == 1) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\timageAtomicExchange(u_image, getCoord(",0x27);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_3e8,local_3e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar11);
          lVar7 = 0xe;
          pcVar9 = "), groupNdx);\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\timageStore(u_image, getCoord(",0x1e);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_3e8,local_3e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar11);
          lVar7 = 0x1e;
          pcVar9 = "), ivec4(groupNdx, 0, 0, 0));\n";
        }
LAB_014c7bd6:
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar9,lVar7);
      }
      else if (*(int *)((long)this + 0x78) == 0) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\tatomicExchange(sb_store.values[getIndex(",0x29);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_3e8,local_3e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar11);
          lVar7 = 0xf;
          pcVar9 = ")], groupNdx);\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\tsb_store.values[getIndex(",0x1a);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_3e8,local_3e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar11);
          lVar7 = 0xf;
          pcVar9 = ")] = groupNdx;\n";
        }
        goto LAB_014c7bd6;
      }
      if (local_3e8 != &local_3d8) {
        operator_delete(local_3e8,local_3d8 + 1);
      }
      iVar11 = iVar11 + 1;
      iVar8 = iVar8 + 3;
    } while (iVar11 < *(int *)((long)this + 0x90));
  }
  InterInvocationTestCase::genBarrierSource_abi_cxx11_(local_320,this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_320[0]._M_dataplus._M_p,local_320[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  if (0 < *(int *)((long)this + 0x90)) {
    iVar8 = 0;
    iVar11 = 0;
    do {
      if (*(char *)((long)this + 0x7e) == '\x01') {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::ostream::operator<<(local_320,iVar11 + 1);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_348,0,(char *)0x0,0x1c5fbe3);
        local_368 = &local_358;
        plVar5 = plVar3 + 2;
        if ((long *)*plVar3 == plVar5) {
          local_358 = *plVar5;
          lStack_350 = plVar3[3];
        }
        else {
          local_358 = *plVar5;
          local_368 = (long *)*plVar3;
        }
        local_360 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_368);
        local_3a8 = &local_398;
        puVar6 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar6) {
          local_398 = *puVar6;
          lStack_390 = plVar3[3];
        }
        else {
          local_398 = *puVar6;
          local_3a8 = (ulong *)*plVar3;
        }
        local_3a0 = plVar3[1];
        *plVar3 = (long)puVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
        std::ostream::operator<<(local_320,iVar8);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
        std::ios_base::~ios_base(local_2b0);
        uVar10 = 0xf;
        if (local_3a8 != &local_398) {
          uVar10 = local_398;
        }
        if (uVar10 < (ulong)(local_380 + local_3a0)) {
          uVar10 = 0xf;
          if (local_388 != local_378) {
            uVar10 = local_378[0];
          }
          if (uVar10 < (ulong)(local_380 + local_3a0)) goto LAB_014c7e38;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_3a8);
        }
        else {
LAB_014c7e38:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_3a8,(ulong)local_388);
        }
        local_3c8 = &local_3b8;
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_3b8 = *plVar3;
          uStack_3b0 = puVar4[3];
        }
        else {
          local_3b8 = *plVar3;
          local_3c8 = (long *)*puVar4;
        }
        local_3c0 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)plVar3 = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_3c8);
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_3d8 = *plVar3;
          lStack_3d0 = puVar4[3];
          local_3e8 = &local_3d8;
        }
        else {
          local_3d8 = *plVar3;
          local_3e8 = (long *)*puVar4;
        }
        local_3e0 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        if (local_3c8 != &local_3b8) {
          operator_delete(local_3c8,local_3b8 + 1);
        }
        if (local_388 != local_378) {
          operator_delete(local_388,local_378[0] + 1);
        }
        if (local_3a8 != &local_398) {
          operator_delete(local_3a8,local_398 + 1);
        }
        if (local_368 != &local_358) {
          operator_delete(local_368,local_358 + 1);
        }
        if (local_348[0] != local_338) {
          operator_delete(local_348[0],local_338[0] + 1);
        }
      }
      else {
        local_3e8 = &local_3d8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_3e8,"gl_LocalInvocationID.xy","");
      }
      if (*(int *)((long)this + 0x78) == 1) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(",0x39);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_3e8,local_3e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar11);
          lVar7 = 0x16;
          pcVar9 = "), 123) == groupNdx);\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\tallOk = allOk && (imageLoad(u_image, getCoord(",0x2f);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_3e8,local_3e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar11);
          lVar7 = 0x13;
          pcVar9 = ")).x == groupNdx);\n";
        }
LAB_014c8131:
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar9,lVar7);
      }
      else if (*(int *)((long)this + 0x78) == 0) {
        if (*(char *)((long)this + 0x7c) == '\x01') {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(",0x3b);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_3e8,local_3e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar11);
          lVar7 = 0x17;
          pcVar9 = ")], 123) == groupNdx);\n";
        }
        else {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"\tallOk = allOk && (sb_store.values[getIndex(",0x2c);
          poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_3e8,local_3e0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar11);
          lVar7 = 0x11;
          pcVar9 = ")] == groupNdx);\n";
        }
        goto LAB_014c8131;
      }
      if (local_3e8 != &local_3d8) {
        operator_delete(local_3e8,local_3d8 + 1);
      }
      iVar11 = iVar11 + 1;
      iVar8 = iVar8 + 2;
    } while (iVar11 < *(int *)((long)this + 0x90));
  }
  psVar1 = local_328;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar1;
}

Assistant:

std::string InvocationOverWriteCase::genShaderMainBlock (void) const
{
	std::ostringstream buf;

	// write

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")], 456);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tsb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")] = 456;\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), 456);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), ivec4(456, 0, 0, 0));\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	// barrier

	buf << genBarrierSource();

	// write over

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		// write another invocation's value or our own value depending on test type
		const std::string localID = (m_syncWithGroup) ? ("(gl_LocalInvocationID.xy + uvec2(" + de::toString(ndx+4) + ", " + de::toString(3*ndx) + ")) % gl_WorkGroupSize.xy") : ("gl_LocalInvocationID.xy");

		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tatomicExchange(sb_store.values[getIndex(" << localID << ", " << ndx << ")], groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tsb_store.values[getIndex(" << localID << ", " << ndx << ")] = groupNdx;\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\timageAtomicExchange(u_image, getCoord(" << localID << ", " << ndx << "), groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\timageStore(u_image, getCoord(" << localID << ", " << ndx << "), ivec4(groupNdx, 0, 0, 0));\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	// barrier

	buf << genBarrierSource();

	// read

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		// check another invocation's value or our own value depending on test type
		const std::string localID = (m_syncWithGroup) ? ("(gl_LocalInvocationID.xy + uvec2(" + de::toString(ndx+1) + ", " + de::toString(2*ndx) + ")) % gl_WorkGroupSize.xy") : ("gl_LocalInvocationID.xy");

		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(" << localID << ", " << ndx << ")], 123) == groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tallOk = allOk && (sb_store.values[getIndex(" << localID << ", " << ndx << ")] == groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(" << localID << ", " << ndx << "), 123) == groupNdx);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\tallOk = allOk && (imageLoad(u_image, getCoord(" << localID << ", " << ndx << ")).x == groupNdx);\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	return buf.str();
}